

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeMoveWindows(ImGuiDockNode *dst_node,ImGuiDockNode *src_node)

{
  ImGuiTabBar *this;
  ImGuiTabItem *pIVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  ImGuiWindow *local_40;
  ImGuiWindow *window;
  int n;
  bool move_tab_bar;
  ImGuiTabBar *src_tab_bar;
  ImGuiDockNode *src_node_local;
  ImGuiDockNode *dst_node_local;
  
  bVar3 = false;
  if ((src_node != (ImGuiDockNode *)0x0) && (bVar3 = false, dst_node != (ImGuiDockNode *)0x0)) {
    bVar3 = dst_node != src_node;
  }
  if (bVar3) {
    this = src_node->TabBar;
    if ((this != (ImGuiTabBar *)0x0) && ((src_node->TabBar->Tabs).Size < (src_node->Windows).Size))
    {
      __assert_fail("src_node->Windows.Size <= src_node->TabBar->Tabs.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3558,"void ImGui::DockNodeMoveWindows(ImGuiDockNode *, ImGuiDockNode *)");
    }
    bVar3 = false;
    if (this != (ImGuiTabBar *)0x0) {
      bVar3 = dst_node->TabBar == (ImGuiTabBar *)0x0;
    }
    if (bVar3) {
      dst_node->TabBar = src_node->TabBar;
      src_node->TabBar = (ImGuiTabBar *)0x0;
    }
    for (window._0_4_ = 0; (int)window < (src_node->Windows).Size; window._0_4_ = (int)window + 1) {
      if (this == (ImGuiTabBar *)0x0) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&src_node->Windows,(int)window);
        local_40 = *ppIVar2;
      }
      else {
        pIVar1 = ImVector<ImGuiTabItem>::operator[](&this->Tabs,(int)window);
        local_40 = pIVar1->Window;
      }
      if (local_40 != (ImGuiWindow *)0x0) {
        local_40->DockNode = (ImGuiDockNode *)0x0;
        local_40->field_0x3e1 = local_40->field_0x3e1 & 0xfe;
        DockNodeAddWindow(dst_node,local_40,(bool)(bVar3 + '\x01'));
      }
    }
    ImVector<ImGuiWindow_*>::clear(&src_node->Windows);
    if ((!bVar3) && (src_node->TabBar != (ImGuiTabBar *)0x0)) {
      if (dst_node->TabBar != (ImGuiTabBar *)0x0) {
        dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
      }
      DockNodeRemoveTabBar(src_node);
    }
    return;
  }
  __assert_fail("src_node && dst_node && dst_node != src_node",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x3555,"void ImGui::DockNodeMoveWindows(ImGuiDockNode *, ImGuiDockNode *)");
}

Assistant:

static void ImGui::DockNodeMoveWindows(ImGuiDockNode* dst_node, ImGuiDockNode* src_node)
{
    // Insert tabs in the same orders as currently ordered (node->Windows isn't ordered)
    IM_ASSERT(src_node && dst_node && dst_node != src_node);
    ImGuiTabBar* src_tab_bar = src_node->TabBar;
    if (src_tab_bar != NULL)
        IM_ASSERT(src_node->Windows.Size <= src_node->TabBar->Tabs.Size);

    // If the dst_node is empty we can just move the entire tab bar (to preserve selection, scrolling, etc.)
    bool move_tab_bar = (src_tab_bar != NULL) && (dst_node->TabBar == NULL);
    if (move_tab_bar)
    {
        dst_node->TabBar = src_node->TabBar;
        src_node->TabBar = NULL;
    }

    for (int n = 0; n < src_node->Windows.Size; n++)
    {
        // DockNode's TabBar may have non-window Tabs manually appended by user
        if (ImGuiWindow* window = src_tab_bar ? src_tab_bar->Tabs[n].Window : src_node->Windows[n])
        {
            window->DockNode = NULL;
            window->DockIsActive = false;
            DockNodeAddWindow(dst_node, window, move_tab_bar ? false : true);
        }
    }
    src_node->Windows.clear();

    if (!move_tab_bar && src_node->TabBar)
    {
        if (dst_node->TabBar)
            dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
        DockNodeRemoveTabBar(src_node);
    }
}